

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_filter.cc
# Opt level: O1

void __thiscall sptk::reaper::FdFilter::FilterBuffer(FdFilter *this,int n_input,int *n_output)

{
  short *psVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  float *pfVar5;
  int iVar6;
  long lVar7;
  float *pfVar8;
  float *pfVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  int16_t *piVar14;
  float *pfVar15;
  float *pfVar16;
  long lVar17;
  int *piVar18;
  uint uVar19;
  short *psVar20;
  int iVar21;
  float fVar22;
  float fVar23;
  
  uVar12 = this->filter_state_;
  if ((uVar12 & 1) != 0) {
    this->to_skip_ = 0;
    this->left_over_ = 0;
    this->first_out_ = 0;
    if (this->n_filter_coeffs_ + this->max_input_ != 0) {
      memset(this->output_delayed_,0,
             (ulong)((this->n_filter_coeffs_ + this->max_input_) - 1) * 4 + 4);
    }
  }
  iVar21 = this->left_over_;
  uVar19 = iVar21 + n_input;
  iVar6 = this->fft_size_;
  iVar4 = (int)uVar19 / iVar6;
  psVar20 = this->input_buffer_;
  if ((uVar12 & 2) == 0 || iVar4 != 0) {
    if (iVar6 != iVar21) {
      piVar14 = this->leftovers_;
      lVar7 = 0;
      do {
        sVar2 = *psVar20;
        psVar20 = psVar20 + 1;
        piVar14[iVar21 + lVar7] = sVar2;
        lVar7 = lVar7 + 1;
      } while (iVar6 - iVar21 != (int)lVar7);
    }
  }
  else {
    piVar14 = this->leftovers_ + iVar21;
    if (n_input != 0) {
      lVar7 = 0;
      lVar13 = 0;
      do {
        piVar14[lVar13] = psVar20[lVar13];
        lVar13 = lVar13 + 1;
        lVar7 = lVar7 + -2;
      } while (n_input != (int)lVar13);
      psVar20 = (short *)((long)psVar20 - lVar7);
      piVar14 = (int16_t *)((long)piVar14 - lVar7);
    }
    iVar4 = 1;
    if ((int)uVar19 < iVar6) {
      memset(piVar14,0,(ulong)(iVar6 + ~uVar19) * 2 + 2);
    }
  }
  if ((uVar12 & 2) == 0 && iVar4 == 0) {
    this->left_over_ = uVar19;
    *n_output = 0;
    this->first_out_ = this->first_out_ | this->filter_state_ & 1U;
  }
  else {
    this->filter_state_ = uVar12 | this->first_out_;
    this->first_out_ = 0;
    pfVar16 = this->output_delayed_;
    if (0 < iVar4) {
      iVar21 = 0;
      do {
        if (iVar21 == 0) {
          iVar6 = this->fft_size_by2_;
          pfVar5 = this->x_;
          pfVar8 = this->y_;
          if ((long)iVar6 != 0) {
            piVar14 = this->leftovers_;
            lVar7 = 0;
            lVar13 = 0;
            do {
              pfVar5[lVar13] = (float)(int)piVar14[lVar13];
              pfVar8[lVar13] = (float)(int)piVar14[iVar6 + lVar13];
              lVar13 = lVar13 + 1;
              lVar7 = lVar7 + -4;
            } while (iVar6 != (int)lVar13);
            pfVar8 = (float *)((long)pfVar8 - lVar7);
            pfVar5 = (float *)((long)pfVar5 - lVar7);
          }
        }
        else {
          iVar6 = this->fft_size_by2_;
          lVar7 = (long)iVar6;
          pfVar5 = this->x_;
          pfVar8 = this->y_;
          if (lVar7 != 0) {
            lVar13 = 0;
            lVar17 = 0;
            do {
              pfVar5[lVar17] = (float)(int)*psVar20;
              psVar1 = psVar20 + lVar7;
              psVar20 = psVar20 + 1;
              pfVar8[lVar17] = (float)(int)*psVar1;
              lVar17 = lVar17 + 1;
              lVar13 = lVar13 + -4;
            } while (iVar6 != (int)lVar17);
            pfVar8 = (float *)((long)pfVar8 - lVar13);
            pfVar5 = (float *)((long)pfVar5 - lVar13);
          }
          psVar20 = psVar20 + lVar7;
        }
        iVar6 = this->fft_size_by2_;
        if (iVar6 != 0) {
          lVar7 = 0;
          do {
            pfVar8[lVar7] = 0.0;
            pfVar5[lVar7] = 0.0;
            lVar7 = lVar7 + 1;
          } while (iVar6 != (int)lVar7);
        }
        FFT::fft(this->fft_,this->x_,this->y_);
        iVar6 = this->fft_size_;
        pfVar5 = this->x_;
        pfVar8 = this->y_;
        if (iVar6 != 0) {
          pfVar9 = this->xf_;
          lVar7 = 0;
          do {
            fVar22 = pfVar9[lVar7];
            fVar23 = pfVar5[lVar7];
            pfVar8[lVar7] = fVar22 * pfVar8[lVar7];
            pfVar5[lVar7] = fVar23 * fVar22;
            lVar7 = lVar7 + 1;
          } while (iVar6 != (int)lVar7);
        }
        FFT::ifft(this->fft_,pfVar5,pfVar8);
        lVar7 = (long)this->fft_size_;
        iVar6 = this->n_filter_coeffs_by2_;
        lVar13 = (long)iVar6;
        iVar10 = this->fft_size_ - iVar6;
        pfVar5 = pfVar16;
        if (0 < lVar13) {
          pfVar8 = this->x_;
          lVar17 = (long)iVar10;
          pfVar9 = pfVar16;
          do {
            pfVar5 = pfVar9 + 1;
            *pfVar9 = pfVar8[lVar17] + *pfVar9;
            lVar17 = lVar17 + 1;
            pfVar9 = pfVar5;
          } while (lVar17 < lVar7);
        }
        if (0 < iVar6) {
          pfVar8 = this->x_;
          lVar17 = 0;
          do {
            *(float *)((long)pfVar5 + lVar17) =
                 *(float *)((long)pfVar8 + lVar17) + *(float *)((long)pfVar5 + lVar17);
            lVar17 = lVar17 + 4;
          } while (lVar13 * 4 - lVar17 != 0);
          pfVar5 = (float *)((long)pfVar5 + lVar17);
        }
        if (iVar6 < iVar10) {
          pfVar8 = this->x_;
          lVar17 = 0;
          do {
            pfVar5[lVar17] = pfVar8[lVar13 + lVar17];
            lVar17 = lVar17 + 1;
          } while (iVar10 - lVar13 != lVar17);
        }
        pfVar5 = pfVar16 + this->fft_size_by2_;
        if (0 < iVar6) {
          pfVar8 = this->y_;
          pfVar9 = pfVar5;
          lVar17 = (long)iVar10;
          do {
            pfVar5 = pfVar9 + 1;
            *pfVar9 = pfVar8[lVar17] + *pfVar9;
            lVar17 = lVar17 + 1;
            pfVar9 = pfVar5;
          } while (lVar17 < lVar7);
        }
        if (0 < iVar6) {
          pfVar8 = this->y_;
          lVar17 = 0;
          do {
            *(float *)((long)pfVar5 + lVar17) =
                 *(float *)((long)pfVar8 + lVar17) + *(float *)((long)pfVar5 + lVar17);
            lVar17 = lVar17 + 4;
          } while (lVar13 * 4 - lVar17 != 0);
          pfVar5 = (float *)((long)pfVar5 + lVar17);
        }
        if (iVar6 < iVar10) {
          pfVar8 = this->y_;
          lVar17 = 0;
          do {
            pfVar5[lVar17] = pfVar8[lVar13 + lVar17];
            lVar17 = lVar17 + 1;
          } while (iVar10 - lVar13 != lVar17);
        }
        iVar21 = iVar21 + 1;
        pfVar16 = pfVar16 + lVar7;
      } while (iVar21 != iVar4);
    }
    iVar21 = (int)((ulong)((long)psVar20 - (long)this->input_buffer_) >> 1);
    iVar6 = n_input - iVar21;
    this->left_over_ = iVar6;
    if (iVar6 != 0) {
      piVar14 = this->leftovers_;
      lVar7 = 0;
      do {
        piVar14[lVar7] = psVar20[lVar7];
        lVar7 = lVar7 + 1;
      } while (iVar6 != (int)lVar7);
      if ((this->filter_state_ & 2) != 0) {
        if (this->fft_size_ != iVar6) {
          memset(piVar14 + iVar6,0,(ulong)(uint)(~n_input + this->fft_size_ + iVar21) * 2 + 2);
        }
        iVar21 = this->fft_size_by2_;
        pfVar5 = this->x_;
        pfVar8 = this->y_;
        pfVar9 = pfVar8;
        pfVar15 = pfVar5;
        if ((long)iVar21 != 0) {
          lVar7 = 0;
          lVar13 = 0;
          do {
            pfVar5[lVar13] = (float)(int)piVar14[lVar13];
            pfVar8[lVar13] = (float)(int)piVar14[iVar21 + lVar13];
            lVar13 = lVar13 + 1;
            lVar7 = lVar7 + -4;
          } while (iVar21 != (int)lVar13);
          pfVar9 = (float *)((long)pfVar8 - lVar7);
          pfVar15 = (float *)((long)pfVar5 - lVar7);
        }
        if (iVar21 != 0) {
          lVar7 = 0;
          do {
            pfVar9[lVar7] = 0.0;
            pfVar15[lVar7] = 0.0;
            lVar7 = lVar7 + 1;
          } while (iVar21 != (int)lVar7);
        }
        FFT::fft(this->fft_,pfVar5,pfVar8);
        iVar21 = this->fft_size_;
        pfVar5 = this->x_;
        pfVar8 = this->y_;
        if (iVar21 != 0) {
          pfVar9 = this->xf_;
          lVar7 = 0;
          do {
            fVar22 = pfVar9[lVar7];
            fVar23 = pfVar5[lVar7];
            pfVar8[lVar7] = fVar22 * pfVar8[lVar7];
            pfVar5[lVar7] = fVar23 * fVar22;
            lVar7 = lVar7 + 1;
          } while (iVar21 != (int)lVar7);
        }
        FFT::ifft(this->fft_,pfVar5,pfVar8);
        iVar21 = this->fft_size_;
        iVar6 = this->n_filter_coeffs_by2_;
        lVar7 = (long)iVar6;
        iVar10 = iVar21 - iVar6;
        pfVar5 = pfVar16;
        if (0 < lVar7) {
          pfVar8 = this->x_;
          lVar13 = (long)iVar10;
          pfVar9 = pfVar16;
          do {
            pfVar5 = pfVar9 + 1;
            *pfVar9 = pfVar8[lVar13] + *pfVar9;
            lVar13 = lVar13 + 1;
            pfVar9 = pfVar5;
          } while (lVar13 < iVar21);
        }
        if (0 < iVar6) {
          pfVar8 = this->x_;
          lVar13 = 0;
          do {
            *(float *)((long)pfVar5 + lVar13) =
                 *(float *)((long)pfVar8 + lVar13) + *(float *)((long)pfVar5 + lVar13);
            lVar13 = lVar13 + 4;
          } while (lVar7 * 4 - lVar13 != 0);
          pfVar5 = (float *)((long)pfVar5 + lVar13);
        }
        if (iVar6 < iVar10) {
          pfVar8 = this->x_;
          lVar13 = 0;
          do {
            pfVar5[lVar13] = pfVar8[lVar7 + lVar13];
            lVar13 = lVar13 + 1;
          } while (iVar10 - lVar7 != lVar13);
        }
        pfVar16 = pfVar16 + this->fft_size_by2_;
        if (0 < iVar6) {
          pfVar5 = this->y_;
          pfVar8 = pfVar16;
          lVar13 = (long)iVar10;
          do {
            pfVar16 = pfVar8 + 1;
            *pfVar8 = pfVar5[lVar13] + *pfVar8;
            lVar13 = lVar13 + 1;
            pfVar8 = pfVar16;
          } while (lVar13 < iVar21);
        }
        if (0 < iVar6) {
          pfVar5 = this->y_;
          lVar13 = 0;
          do {
            *(float *)((long)pfVar16 + lVar13) =
                 *(float *)((long)pfVar5 + lVar13) + *(float *)((long)pfVar16 + lVar13);
            lVar13 = lVar13 + 4;
          } while (lVar7 * 4 - lVar13 != 0);
          pfVar16 = (float *)((long)pfVar16 + lVar13);
        }
        if (iVar6 < iVar10) {
          pfVar5 = this->y_;
          lVar13 = 0;
          do {
            pfVar16[lVar13] = pfVar5[lVar7 + lVar13];
            lVar13 = lVar13 + 1;
          } while (iVar10 - lVar7 != lVar13);
        }
      }
    }
    uVar12 = this->n_filter_coeffs_by2_ + this->left_over_ & (this->filter_state_ << 0x1e) >> 0x1f;
    iVar10 = this->fft_size_ * iVar4 -
             ((-(this->filter_state_ & 1U) & this->n_filter_coeffs_by2_) + this->to_skip_);
    iVar6 = (int)(iVar10 + uVar12 + -1) / this->decimate_;
    iVar11 = iVar6 + 1;
    *n_output = iVar11;
    pfVar16 = this->output_delayed_;
    iVar21 = this->decimate_;
    if (iVar11 != 0) {
      piVar14 = this->output_buffer_;
      piVar18 = &this->n_filter_coeffs_by2_;
      if ((this->filter_state_ & 1) == 0) {
        piVar18 = &this->to_skip_;
      }
      pfVar5 = pfVar16 + *piVar18;
      lVar7 = 0;
      do {
        fVar22 = 32767.0;
        if (*pfVar5 <= 32767.0) {
          fVar22 = *pfVar5;
        }
        fVar23 = -32768.0;
        if (-32768.0 <= fVar22) {
          fVar23 = fVar22;
        }
        piVar14[lVar7] =
             (int16_t)(int)(fVar23 + *(float *)(&DAT_0012afe8 + (ulong)(0.0 < fVar23) * 4));
        lVar7 = lVar7 + 1;
        pfVar5 = pfVar5 + iVar21;
      } while (iVar6 + 1 != (int)lVar7);
    }
    iVar6 = this->n_filter_coeffs_;
    if (iVar6 != 0) {
      iVar3 = this->fft_size_;
      do {
        *pfVar16 = pfVar16[iVar4 * iVar3];
        pfVar16 = pfVar16 + 1;
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
    }
    this->to_skip_ = iVar21 * iVar11 - (iVar10 + uVar12);
  }
  return;
}

Assistant:

void FdFilter::FilterBuffer(int n_input, int *n_output) {
  int16_t *p, *r, *p2;
  float *dp1, *dp2, *q, half = 0.5;
  int  i, j, k, npass;
  int totaln;

  if (filter_state_ & 1) {  /* first call with this signal and filter? */
    first_out_ = 0;
    to_skip_ = 0;
    left_over_ = 0;
    for (i = max_input_+n_filter_coeffs_, q = output_delayed_; i--;)
      *q++ = 0.0;
  }    /* end of once-per-filter-invocation initialization */

  npass = (n_input + left_over_) / fft_size_;
  if (!npass && (filter_state_ & 2)) {  // if it's the end...
    // Append the input to the leftovers, then pad with zeros.
    p = input_buffer_;
    for (p = input_buffer_, r = leftovers_ + left_over_, i = n_input; i--;) {
      *r++ = *p++; /* append to leftovers_ from prev. call */
    }
    int to_pad = fft_size_ - (left_over_ + n_input);
    for (int i = 0; i < to_pad; ++i) {
      *r++ = 0;
    }
    npass = 1;
  } else {
    /* This is the normal non-boundary course of action. */
    for (p = input_buffer_, r = leftovers_ + left_over_,
           i = fft_size_ - left_over_; i--;)
      *r++ = *p++; /* append to leftovers_ from prev. call */
  }
  if (!npass && !(filter_state_ & 2)) {  // it's not the end, but don't
                                       // have enough data for a loop.
    left_over_ += n_input;
    *n_output = 0;
    first_out_ |= filter_state_ & 1;  // flag that start of sig is still here.
    return;
  }
  filter_state_ |= first_out_;
  first_out_ = 0;

  /* >>>>>>>>>>>>>> Here's the main processing loop. <<<<<<<<<<<<< */
  for (/* p set up above */ q = output_delayed_, i = 0; i < npass;
                            i++, q += fft_size_) {
    if (i) {
      for (r = p + fft_size_by2_, j = fft_size_by2_, dp1 = x_, dp2 = y_; j--;) {
        *dp1++ = *p++;
        *dp2++ = *r++;
      }
      p += fft_size_by2_;
    } else {
      for (p2 = leftovers_, r = p2 + fft_size_by2_, j = fft_size_by2_,
             dp1 = x_, dp2 = y_; j--;) {
        *dp1++ = *p2++;
        *dp2++ = *r++;
      }
    }
    for (j = fft_size_by2_; j--;)
      *dp1++ = *dp2++ = 0.0;

    /* Filtering is done in the frequency domain; transform two real arrays. */
    fft_->fft(x_, y_);
    ComplexDotProduct(fft_size_, x_, y_, xf_, NULL, x_, y_);
    fft_->ifft(x_, y_);

    /* Overlap and add. */
    for (dp2 = q, j = fft_size_ - n_filter_coeffs_by2_; j < fft_size_; j++)
      *dp2++ += x_[j];
    for (j = 0, k = n_filter_coeffs_by2_; j < k; j++)
      *dp2++ += x_[j];
    for (j = n_filter_coeffs_by2_, k = fft_size_ - n_filter_coeffs_by2_;
         j < k; j++)
      *dp2++ = x_[j];

    for (dp2 = q+fft_size_by2_, j = fft_size_ - n_filter_coeffs_by2_;
         j < fft_size_; j++)
      *dp2++ += y_[j];
    for (j = 0, k = n_filter_coeffs_by2_; j < k; j++)
      *dp2++ += y_[j];
    for (j = n_filter_coeffs_by2_, k = fft_size_ - n_filter_coeffs_by2_;
         j < k; j++)
      *dp2++ = y_[j];
  }    /* end of main processing loop */

  left_over_ = n_input - (p-input_buffer_);
  for (i = left_over_, r = leftovers_; i--;)  // Save unused input
                                              // samples for next call.
    *r++ = *p++;
  /* If signal end is here, must process any unused input. */
  if (left_over_ && (filter_state_ & 2)) {  // Must do one more zero-pad pass.
    for (p2 = leftovers_ + left_over_, i = fft_size_ - left_over_; i--;)
      *p2++ = 0;
    for (p2 = leftovers_, r = p2 + fft_size_by2_, j = fft_size_by2_,
           dp1 = x_, dp2 = y_; j--;) {
      *dp1++ = *p2++;
      *dp2++ = *r++;
    }
    for (j = fft_size_by2_; j--;)
      *dp1++ = *dp2++ = 0.0;
    /* Filtering is done in the frequency domain; transform two real arrays. */
    fft_->fft(x_, y_);
    ComplexDotProduct(fft_size_, x_, y_, xf_, NULL, x_, y_);
    fft_->ifft(x_, y_);

    /* Overlap and add. */
    for (dp2 = q, j = fft_size_ - n_filter_coeffs_by2_; j < fft_size_; j++)
      *dp2++ += x_[j];
    for (j = 0, k = n_filter_coeffs_by2_; j < k; j++)
      *dp2++ += x_[j];
    for (j = n_filter_coeffs_by2_, k = fft_size_ - n_filter_coeffs_by2_;
         j < k; j++)
      *dp2++ = x_[j];

    for (dp2 = q+fft_size_by2_, j = fft_size_ - n_filter_coeffs_by2_;
         j < fft_size_; j++)
      *dp2++ += y_[j];
    for (j = 0, k = n_filter_coeffs_by2_; j < k; j++)
      *dp2++ += y_[j];
    for (j = n_filter_coeffs_by2_, k = fft_size_ - n_filter_coeffs_by2_;
         j < k; j++)
      *dp2++ = y_[j];
  }
  /* total good output samples in ob: */
  totaln = (((npass * fft_size_) - to_skip_ -
             ((1 & filter_state_)? n_filter_coeffs_by2_ : 0)) +
            ((filter_state_ & 2)? left_over_ + n_filter_coeffs_by2_ : 0));
  /* number returned to caller: */
  *n_output = 1 + (totaln - 1) / decimate_;  // possible decimation for
                                           // downsampling
  /* Round, decimate and output the samples. */
  float f_temp;
  q = (filter_state_ & 1)? output_delayed_ + (n_filter_coeffs_by2_) :
                                output_delayed_ + to_skip_;
  for (j = decimate_, i =  *n_output, p = output_buffer_; i-- ; q += j) {
    if ((f_temp = *q) > 32767.0)
      f_temp = 32767.0;
    if (f_temp < -32768.0)
      f_temp = -32768.0;
    *p++ = static_cast<int16_t>((f_temp > 0.0) ? half + f_temp : f_temp - half);
  }

  for (dp1 = output_delayed_ + npass*fft_size_, j = n_filter_coeffs_,
         dp2 = output_delayed_; j--;) /*save mem for next call */
    *dp2++ = *dp1++;
  /* If decimating, number to skip on next call. */
  to_skip_ = (*n_output * decimate_) - totaln;
}